

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall
FStateDefinitions::InstallStates(FStateDefinitions *this,PClassActor *info,AActor *defaults)

{
  char *pcVar1;
  AActor *pAVar2;
  subsector_t *psVar3;
  FState *pFVar4;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  FState *local_28;
  FState *state;
  AActor *defaults_local;
  PClassActor *info_local;
  FStateDefinitions *this_local;
  
  state = (FState *)defaults;
  defaults_local = (AActor *)info;
  info_local = (PClassActor *)this;
  if (defaults == (AActor *)0x0) {
    pcVar1 = FName::GetChars(&(info->super_PClass).super_PNativeStruct.super_PStruct.
                              super_PNamedType.TypeName);
    I_Error("Called InstallStates without actor defaults in %s",pcVar1);
  }
  local_28 = FindState(this,"Spawn");
  if (local_28 == (FState *)0x0) {
    pAVar2 = GetDefault<AActor>();
    SetStateLabel(this,"Spawn",pAVar2->SpawnState,'\x01');
  }
  if (defaults_local->subsector != (subsector_t *)0x0) {
    FStateLabels::Destroy((FStateLabels *)defaults_local->subsector);
    M_Free(defaults_local->subsector);
  }
  psVar3 = (subsector_t *)CreateStateLabelList(&this->StateLabels);
  pAVar2 = defaults_local;
  defaults_local->subsector = psVar3;
  FName::FName(&local_2c,NAME_Spawn);
  pFVar4 = PClassActor::FindState((PClassActor *)pAVar2,&local_2c);
  pAVar2 = defaults_local;
  *(FState **)&state[0x1b].sprite = pFVar4;
  FName::FName(&local_30,NAME_See);
  pFVar4 = PClassActor::FindState((PClassActor *)pAVar2,&local_30);
  pAVar2 = defaults_local;
  *(FState **)&state[0x1b].Light = pFVar4;
  FName::FName(&local_34,NAME_Melee);
  pFVar4 = PClassActor::FindState((PClassActor *)pAVar2,&local_34);
  pAVar2 = defaults_local;
  *(FState **)&state[0x1b].Misc1 = pFVar4;
  FName::FName(&local_38,NAME_Missile);
  pFVar4 = PClassActor::FindState((PClassActor *)pAVar2,&local_38);
  state[0x1c].NextState = pFVar4;
  return;
}

Assistant:

void FStateDefinitions::InstallStates(PClassActor *info, AActor *defaults)
{
	if (defaults == nullptr)
	{
		I_Error("Called InstallStates without actor defaults in %s", info->TypeName.GetChars());
	}

	// First ensure we have a valid spawn state.
	FState *state = FindState("Spawn");

	if (state == NULL)
	{
		// A NULL spawn state will crash the engine so set it to something valid.
		SetStateLabel("Spawn", GetDefault<AActor>()->SpawnState);
	}

	if (info->StateList != NULL) 
	{
		info->StateList->Destroy();
		M_Free(info->StateList);
	}
	info->StateList = CreateStateLabelList(StateLabels);

	// Cache these states as member veriables.
	defaults->SpawnState = info->FindState(NAME_Spawn);
	defaults->SeeState = info->FindState(NAME_See);
	// Melee and Missile states are manipulated by the scripted marines so they
	// have to be stored locally
	defaults->MeleeState = info->FindState(NAME_Melee);
	defaults->MissileState = info->FindState(NAME_Missile);
}